

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O3

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::epoch_check
          (cache<uint256,_SignatureCacheHasher> *this)

{
  __atomic_base<unsigned_char> *p_Var1;
  long lVar2;
  _Bit_type *p_Var3;
  uint32_t i;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->epoch_heuristic_counter == 0) {
    uVar6 = this->size;
    if (uVar6 == 0) {
      uVar7 = this->epoch_size;
      uVar5 = 0;
      uVar4 = 0;
      if (uVar7 == 0) goto LAB_0042e439;
    }
    else {
      uVar8 = 0;
      uVar5 = 0;
      do {
        uVar7 = 0;
        if (((this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar8 >> 6] >>
             (uVar8 & 0x3f) & 1) != 0) {
          uVar7 = (uint)(((this->collection_flags).mem._M_t.
                          super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                          .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                          [uVar8 >> 3].super___atomic_base<unsigned_char>._M_i >> ((uint)uVar8 & 7)
                         & 1) == 0);
        }
        uVar5 = uVar5 + uVar7;
        uVar7 = (uint)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar6 != uVar7);
      uVar7 = this->epoch_size;
      if (uVar7 <= uVar5) {
        uVar7 = 0;
        do {
          p_Var3 = (this->epoch_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar8 = p_Var3[uVar7 >> 6];
          if ((uVar8 >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
            LOCK();
            p_Var1 = &(this->collection_flags).mem._M_t.
                      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                      [uVar7 >> 3].super___atomic_base<unsigned_char>;
            p_Var1->_M_i = p_Var1->_M_i | (byte)(1 << ((byte)uVar7 & 7));
            UNLOCK();
            uVar6 = this->size;
          }
          else {
            p_Var3[uVar7 >> 6] = uVar8 & ~(1L << ((byte)uVar7 & 0x3f));
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar6);
        uVar4 = this->epoch_size;
        goto LAB_0042e439;
      }
    }
    uVar6 = uVar7 - uVar5;
    if (uVar7 - uVar5 < uVar7 >> 4) {
      uVar6 = uVar7 >> 4;
    }
    uVar4 = uVar6 + (uVar6 == 0);
  }
  else {
    uVar4 = this->epoch_heuristic_counter - 1;
  }
LAB_0042e439:
  this->epoch_heuristic_counter = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void epoch_check()
    {
        if (epoch_heuristic_counter != 0) {
            --epoch_heuristic_counter;
            return;
        }
        // count the number of elements from the latest epoch which
        // have not been erased.
        uint32_t epoch_unused_count = 0;
        for (uint32_t i = 0; i < size; ++i)
            epoch_unused_count += epoch_flags[i] &&
                                  !collection_flags.bit_is_set(i);
        // If there are more non-deleted entries in the current epoch than the
        // epoch size, then allow_erase on all elements in the old epoch (marked
        // false) and move all elements in the current epoch to the old epoch
        // but do not call allow_erase on their indices.
        if (epoch_unused_count >= epoch_size) {
            for (uint32_t i = 0; i < size; ++i)
                if (epoch_flags[i])
                    epoch_flags[i] = false;
                else
                    allow_erase(i);
            epoch_heuristic_counter = epoch_size;
        } else
            // reset the epoch_heuristic_counter to next do a scan when worst
            // case behavior (no intermittent erases) would exceed epoch size,
            // with a reasonable minimum scan size.
            // Ordinarily, we would have to sanity check std::min(epoch_size,
            // epoch_unused_count), but we already know that `epoch_unused_count
            // < epoch_size` in this branch
            epoch_heuristic_counter = std::max(1u, std::max(epoch_size / 16,
                        epoch_size - epoch_unused_count));
    }